

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O0

bool __thiscall llvm::yaml::Input::bitSetMatch(Input *this,char *Str,bool param_2)

{
  HNode *pHVar1;
  bool bVar2;
  ret_type pSVar3;
  pointer Val;
  Twine local_c0;
  Twine local_a8;
  reference local_90;
  StringRef local_80;
  StringRef local_70;
  ret_type local_60;
  ScalarHNode *SN;
  unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_> *N;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>,_std::allocator<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>_>
  *__range2;
  uint Index;
  SequenceHNode *SQ;
  bool param_2_local;
  char *Str_local;
  Input *this_local;
  
  bVar2 = std::error_code::operator_cast_to_bool(&this->EC);
  if (!bVar2) {
    pSVar3 = dyn_cast<llvm::yaml::Input::SequenceHNode,llvm::yaml::Input::HNode>(this->CurrentNode);
    if (pSVar3 == (ret_type)0x0) {
      pHVar1 = this->CurrentNode;
      Twine::Twine(&local_c0,"expected sequence of bit values");
      setError(this,pHVar1,&local_c0);
    }
    else {
      __range2._4_4_ = 0;
      __end2 = std::
               vector<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>,_std::allocator<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>_>
               ::begin(&pSVar3->Entries);
      N = (unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_> *)
          std::
          vector<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>,_std::allocator<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>_>
          ::end(&pSVar3->Entries);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_*,_std::vector<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>,_std::allocator<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>_>_>
                                         *)&N), bVar2) {
        SN = (ScalarHNode *)
             __gnu_cxx::
             __normal_iterator<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_*,_std::vector<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>,_std::allocator<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>_>_>
             ::operator*(&__end2);
        Val = std::
              unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>::
              get((unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>
                   *)SN);
        local_60 = dyn_cast<llvm::yaml::Input::ScalarHNode,llvm::yaml::Input::HNode>(Val);
        if (local_60 == (ret_type)0x0) {
          pHVar1 = this->CurrentNode;
          Twine::Twine(&local_a8,"unexpected scalar in sequence of bit values");
          setError(this,pHVar1,&local_a8);
        }
        else {
          local_70 = ScalarHNode::value(local_60);
          StringRef::StringRef(&local_80,Str);
          bVar2 = StringRef::equals(&local_70,local_80);
          if (bVar2) {
            local_90 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                 (&this->BitValuesUsed,(ulong)__range2._4_4_);
            std::_Bit_reference::operator=(&local_90,true);
            return true;
          }
        }
        __range2._4_4_ = __range2._4_4_ + 1;
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_*,_std::vector<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>,_std::allocator<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>_>_>
        ::operator++(&__end2);
      }
    }
  }
  return false;
}

Assistant:

bool Input::bitSetMatch(const char *Str, bool) {
  if (EC)
    return false;
  if (SequenceHNode *SQ = dyn_cast<SequenceHNode>(CurrentNode)) {
    unsigned Index = 0;
    for (auto &N : SQ->Entries) {
      if (ScalarHNode *SN = dyn_cast<ScalarHNode>(N.get())) {
        if (SN->value().equals(Str)) {
          BitValuesUsed[Index] = true;
          return true;
        }
      } else {
        setError(CurrentNode, "unexpected scalar in sequence of bit values");
      }
      ++Index;
    }
  } else {
    setError(CurrentNode, "expected sequence of bit values");
  }
  return false;
}